

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * __thiscall
pbrt::LightHandle::Bounds(LightBounds *__return_storage_ptr__,LightHandle *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (2 < uVar2) {
      if ((uVar2 & 6) == 2) {
        ProjectionLight::Bounds(__return_storage_ptr__,(ProjectionLight *)(uVar1 & 0xffffffffffff));
        return __return_storage_ptr__;
      }
      GoniometricLight::Bounds(__return_storage_ptr__,(GoniometricLight *)(uVar1 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    if (uVar2 != 2) {
      PointLight::Bounds(__return_storage_ptr__,(PointLight *)(uVar1 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
  }
  else if (uVar2 - 4 < 3) {
    if (uVar2 - 4 == 2) {
      DiffuseAreaLight::Bounds(__return_storage_ptr__,(DiffuseAreaLight *)(uVar1 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    SpotLight::Bounds(__return_storage_ptr__,(SpotLight *)(uVar1 & 0xffffffffffff));
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  __return_storage_ptr__->phi = 0.0;
  __return_storage_ptr__->theta_o = 0.0;
  __return_storage_ptr__->theta_e = 0.0;
  __return_storage_ptr__->cosTheta_o = 0.0;
  __return_storage_ptr__->cosTheta_e = 0.0;
  __return_storage_ptr__->twoSided = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x39 = 0;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  LightBounds::LightBounds(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

LightBounds LightHandle::Bounds() const {
    auto bounds = [](auto ptr) { return ptr->Bounds(); };
    return DispatchCPU(bounds);
}